

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
::has_element(raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *this,value_type *elem,size_t hashval)

{
  char *pcVar1;
  slot_type *psVar2;
  int iVar3;
  ctrl_t *pcVar4;
  ulong uVar5;
  slot_type *psVar6;
  pointer __s2;
  size_t __n;
  uint uVar7;
  ushort uVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  bool bVar30;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  __m128i match;
  char cVar31;
  char cVar35;
  char cVar36;
  char cVar37;
  
  pcVar4 = this->ctrl_;
  if (pcVar4 != (ctrl_t *)0x0) {
    uVar5 = this->capacity_;
    if ((uVar5 + 1 & uVar5) != 0) {
      __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
    }
    uVar28 = hashval >> 7;
    auVar32 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
    auVar32 = pshuflw(auVar32,auVar32,0);
    psVar6 = this->slots_;
    __s2 = (elem->first)._M_dataplus._M_p;
    __n = (elem->first)._M_string_length;
    iVar3 = elem->second;
    uVar29 = 0;
    while( true ) {
      uVar28 = uVar28 & uVar5;
      pcVar1 = pcVar4 + uVar28;
      cVar9 = *pcVar1;
      cVar10 = pcVar1[1];
      cVar11 = pcVar1[2];
      cVar12 = pcVar1[3];
      cVar13 = pcVar1[4];
      cVar14 = pcVar1[5];
      cVar15 = pcVar1[6];
      cVar16 = pcVar1[7];
      cVar17 = pcVar1[8];
      cVar18 = pcVar1[9];
      cVar19 = pcVar1[10];
      cVar20 = pcVar1[0xb];
      cVar21 = pcVar1[0xc];
      cVar22 = pcVar1[0xd];
      cVar23 = pcVar1[0xe];
      cVar24 = pcVar1[0xf];
      cVar31 = auVar32[0];
      auVar33[0] = -(cVar31 == cVar9);
      cVar35 = auVar32[1];
      auVar33[1] = -(cVar35 == cVar10);
      cVar36 = auVar32[2];
      auVar33[2] = -(cVar36 == cVar11);
      cVar37 = auVar32[3];
      auVar33[3] = -(cVar37 == cVar12);
      auVar33[4] = -(cVar31 == cVar13);
      auVar33[5] = -(cVar35 == cVar14);
      auVar33[6] = -(cVar36 == cVar15);
      auVar33[7] = -(cVar37 == cVar16);
      auVar33[8] = -(cVar31 == cVar17);
      auVar33[9] = -(cVar35 == cVar18);
      auVar33[10] = -(cVar36 == cVar19);
      auVar33[0xb] = -(cVar37 == cVar20);
      auVar33[0xc] = -(cVar31 == cVar21);
      auVar33[0xd] = -(cVar35 == cVar22);
      auVar33[0xe] = -(cVar36 == cVar23);
      auVar33[0xf] = -(cVar37 == cVar24);
      uVar8 = (ushort)(SUB161(auVar33 >> 7,0) & 1) | (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe | (ushort)(auVar33[0xf] >> 7) << 0xf;
      if (uVar8 != 0) {
        uVar26 = (uint)uVar8;
        do {
          uVar7 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
            }
          }
          uVar27 = uVar7 + uVar28 & uVar5;
          if (*(size_t *)((long)psVar6 + uVar27 * 0x28 + 8) == __n) {
            psVar2 = psVar6 + uVar27;
            bVar30 = true;
            if (__n != 0) {
              iVar25 = bcmp((psVar2->value).first._M_dataplus._M_p,__s2,__n);
              bVar30 = iVar25 == 0;
            }
            if ((bVar30) && ((psVar2->value).second == iVar3)) {
              return true;
            }
          }
          uVar26 = uVar26 - 1 & uVar26;
        } while (uVar26 != 0);
      }
      auVar34[0] = -(cVar9 == -0x80);
      auVar34[1] = -(cVar10 == -0x80);
      auVar34[2] = -(cVar11 == -0x80);
      auVar34[3] = -(cVar12 == -0x80);
      auVar34[4] = -(cVar13 == -0x80);
      auVar34[5] = -(cVar14 == -0x80);
      auVar34[6] = -(cVar15 == -0x80);
      auVar34[7] = -(cVar16 == -0x80);
      auVar34[8] = -(cVar17 == -0x80);
      auVar34[9] = -(cVar18 == -0x80);
      auVar34[10] = -(cVar19 == -0x80);
      auVar34[0xb] = -(cVar20 == -0x80);
      auVar34[0xc] = -(cVar21 == -0x80);
      auVar34[0xd] = -(cVar22 == -0x80);
      auVar34[0xe] = -(cVar23 == -0x80);
      auVar34[0xf] = -(cVar24 == -0x80);
      if ((((((((((((((((auVar34 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar34 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar34 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar34 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar34 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar34 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar34 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar34 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar34 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar34 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar34 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar34 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar24 == -0x80)
      break;
      uVar28 = uVar28 + uVar29 + 0x10;
      uVar29 = uVar29 + 0x10;
      if (uVar5 <= uVar29) {
        __assert_fail("seq.getindex() < capacity_ && \"full table!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                      ,0x87c,
                      "bool phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::basic_string<char>, int>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<std::pair<const std::basic_string<char>, int>>>::has_element(const value_type &__restrict, size_t) const [Policy = phmap::priv::FlatHashMapPolicy<std::basic_string<char>, int>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<std::pair<const std::basic_string<char>, int>>]"
                     );
      }
    }
  }
  return false;
}

Assistant:

bool has_element(const value_type& PHMAP_RESTRICT elem, size_t hashval) const {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return false;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::element(slots_ + seq.offset((size_t)i)) ==
                                      elem))
                    return true;
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) return false;
            seq.next();
            assert(seq.getindex() < capacity_ && "full table!");
        }
        return false;
    }